

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O3

ostream * operator<<(ostream *o,span<const_double> *d)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  char local_29;
  
  if (7 < d->_len) {
    pdVar1 = d->_base;
    uVar3 = d->_len & 0xfffffffffffffff8;
    std::ostream::_M_insert<double>(*pdVar1);
    if (uVar3 != 8) {
      uVar2 = 8;
      do {
        local_29 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(o,&local_29,1);
        std::ostream::_M_insert<double>(*(double *)((long)pdVar1 + uVar2));
        uVar2 = uVar2 + 8;
      } while (uVar3 != uVar2);
    }
  }
  return o;
}

Assistant:

std::ostream &operator<<(std::ostream &o, const mpt::span<T> &d)
{
	typename mpt::span<T>::iterator begin = d.begin(), end = d.end();
	if (begin == end) {
		return o;
	}
	o << *begin;
	while (++begin != end) {
		o << ' ' << *begin;
	}
	return o;
}